

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZMCTargetDesc.c
# Opt level: O1

uint SystemZMC_getFirstReg(uint Reg)

{
  uint uVar1;
  long lVar2;
  
  if (SystemZMC_getFirstReg_Initialized == '\0') {
    SystemZMC_getFirstReg_Initialized = '\x01';
    lVar2 = 0;
    do {
      uVar1 = (uint)lVar2;
      SystemZMC_getFirstReg::Map[SystemZMC_GR32Regs[lVar2]] = uVar1;
      SystemZMC_getFirstReg::Map[SystemZMC_GRH32Regs[lVar2]] = uVar1;
      SystemZMC_getFirstReg::Map[SystemZMC_GR64Regs[lVar2]] = uVar1;
      SystemZMC_getFirstReg::Map[SystemZMC_GR128Regs[lVar2]] = uVar1;
      SystemZMC_getFirstReg::Map[SystemZMC_FP32Regs[lVar2]] = uVar1;
      SystemZMC_getFirstReg::Map[SystemZMC_FP64Regs[lVar2]] = uVar1;
      SystemZMC_getFirstReg::Map[SystemZMC_FP128Regs[lVar2]] = uVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
  }
  return SystemZMC_getFirstReg::Map[Reg];
}

Assistant:

unsigned SystemZMC_getFirstReg(unsigned Reg)
{
	static unsigned Map[SystemZ_NUM_TARGET_REGS];
	static int Initialized = 0;
	unsigned I;

	if (!Initialized) {
		Initialized = 1;
		for (I = 0; I < 16; ++I) {
			Map[SystemZMC_GR32Regs[I]] = I;
			Map[SystemZMC_GRH32Regs[I]] = I;
			Map[SystemZMC_GR64Regs[I]] = I;
			Map[SystemZMC_GR128Regs[I]] = I;
			Map[SystemZMC_FP32Regs[I]] = I;
			Map[SystemZMC_FP64Regs[I]] = I;
			Map[SystemZMC_FP128Regs[I]] = I;
		}
	}

	// assert(Reg < SystemZ_NUM_TARGET_REGS);
	return Map[Reg];
}